

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof2.h
# Opt level: O0

void Prf_ManStopP(Prf_Man_t **p)

{
  Prf_Man_t **p_local;
  
  Prf_ManStop(*p);
  *p = (Prf_Man_t *)0x0;
  return;
}

Assistant:

static inline void Prf_ManStopP( Prf_Man_t ** p )
{
    Prf_ManStop( *p );
    *p = NULL;
}